

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O3

void __thiscall duckdb::TableRelation::Delete(TableRelation *this,string *condition)

{
  shared_ptr<duckdb::ClientContextWrapper,_true> *this_00;
  type context;
  pointer __args_2;
  pointer pTVar1;
  pointer pTVar2;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_01
  ;
  undefined1 local_51;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_50;
  undefined1 local_48 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  shared_ptr<duckdb::DeleteRelation,_true> del;
  
  this_00 = &(this->super_Relation).context;
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(this_00);
  ClientContextWrapper::GetContext((ClientContextWrapper *)(local_48 + 8));
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)(local_48 + 8));
  ParseCondition((duckdb *)&local_50,context,condition);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  this_01 = &this->description;
  __args_2 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(this_01);
  pTVar1 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_01);
  pTVar2 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_01);
  local_48._8_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::DeleteRelation,std::allocator<duckdb::DeleteRelation>,duckdb::shared_ptr<duckdb::ClientContextWrapper,true>&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            (&local_38,(DeleteRelation **)(local_48 + 8),
             (allocator<duckdb::DeleteRelation> *)&local_51,this_00,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_50,&__args_2->database,&pTVar1->schema,&pTVar2->table);
  shared_ptr<duckdb::DeleteRelation,_true>::shared_ptr
            (&del,(shared_ptr<duckdb::DeleteRelation> *)(local_48 + 8));
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  shared_ptr<duckdb::DeleteRelation,_true>::operator->(&del);
  Relation::Execute((Relation *)local_48);
  if ((_func_int **)local_48._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_48._0_8_ + 8))();
  }
  local_48._0_8_ = (_func_int **)0x0;
  if (del.internal.super___shared_ptr<duckdb::DeleteRelation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (del.internal.super___shared_ptr<duckdb::DeleteRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return;
}

Assistant:

void TableRelation::Delete(const string &condition) {
	auto cond = ParseCondition(*context->GetContext(), condition);
	auto del = make_shared_ptr<DeleteRelation>(context, std::move(cond), description->database, description->schema,
	                                           description->table);
	del->Execute();
}